

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosTagger.hpp
# Opt level: O2

char * __thiscall cppjieba::PosTagger::SpecialRule(PosTagger *this,RuneStrArray *unicode)

{
  uint uVar1;
  RuneStr *pRVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  size_t i;
  ulong uVar7;
  
  pRVar2 = unicode->ptr_;
  uVar6 = 0;
  uVar5 = 0;
  uVar7 = 0;
  while ((uVar7 < unicode->size_ && (uVar5 < unicode->size_ >> 1))) {
    uVar1 = pRVar2->rune;
    if ((uVar1 < 0x80) && (uVar5 = uVar5 + 1, 0x2f < uVar1)) {
      uVar6 = uVar6 + (uVar1 < 0x3a);
    }
    uVar7 = uVar7 + 1;
    pRVar2 = pRVar2 + 1;
  }
  pcVar4 = "eng";
  if (uVar6 == uVar5) {
    pcVar4 = "m";
  }
  pcVar3 = "x";
  if (uVar5 != 0) {
    pcVar3 = pcVar4;
  }
  return pcVar3;
}

Assistant:

const char* SpecialRule(const RuneStrArray& unicode) const {
    size_t m = 0;
    size_t eng = 0;
    for (size_t i = 0; i < unicode.size() && eng < unicode.size() / 2; i++) {
      if (unicode[i].rune < 0x80) {
        eng ++;
        if ('0' <= unicode[i].rune && unicode[i].rune <= '9') {
          m++;
        }
      }
    }
    // ascii char is not found
    if (eng == 0) {
      return POS_X;
    }
    // all the ascii is number char
    if (m == eng) {
      return POS_M;
    }
    // the ascii chars contain english letter
    return POS_ENG;
  }